

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QDateTimeEditPrivate::updateTimeZone(QDateTimeEditPrivate *this)

{
  QVariant *this_00;
  QVariant *this_01;
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined8 local_68;
  QDateTime local_60 [8];
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_QAbstractSpinBoxPrivate).minimum;
  ::QVariant::toDateTime();
  QDateTime::toTimeZone((QTimeZone *)local_60);
  ::QVariant::QVariant(&local_58,local_60);
  ::QVariant::operator=(this_00,&local_58);
  ::QVariant::~QVariant(&local_58);
  QDateTime::~QDateTime(local_60);
  QDateTime::~QDateTime((QDateTime *)&local_68);
  this_01 = &(this->super_QAbstractSpinBoxPrivate).maximum;
  ::QVariant::toDateTime();
  QDateTime::toTimeZone((QTimeZone *)local_60);
  ::QVariant::QVariant(&local_58,local_60);
  ::QVariant::operator=(this_01,&local_58);
  ::QVariant::~QVariant(&local_58);
  QDateTime::~QDateTime(local_60);
  QDateTime::~QDateTime((QDateTime *)&local_68);
  ::QVariant::toDateTime();
  QDateTime::toTimeZone((QTimeZone *)local_60);
  ::QVariant::QVariant(&local_58,local_60);
  ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).value,&local_58);
  ::QVariant::~QVariant(&local_58);
  QDateTime::~QDateTime(local_60);
  QDateTime::~QDateTime((QDateTime *)&local_68);
  if (((this->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
       super_QFlagsStorage<QDateTimeEdit::Section>.i & 0x700) == 0) {
    iVar1 = ::QVariant::toTime();
    iVar2 = ::QVariant::toTime();
    if (iVar2 <= iVar1) {
      local_68 = ::QVariant::toDate();
      QDate::startOfDay((QTimeZone *)local_60);
      ::QVariant::QVariant(&local_58,local_60);
      ::QVariant::operator=(this_00,&local_58);
      ::QVariant::~QVariant(&local_58);
      QDateTime::~QDateTime(local_60);
      local_68 = ::QVariant::toDate();
      QDate::endOfDay((QTimeZone *)local_60);
      ::QVariant::QVariant(&local_58,local_60);
      ::QVariant::operator=(this_01,&local_58);
      ::QVariant::~QVariant(&local_58);
      QDateTime::~QDateTime(local_60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::updateTimeZone()
{
    minimum = minimum.toDateTime().toTimeZone(timeZone);
    maximum = maximum.toDateTime().toTimeZone(timeZone);
    value = value.toDateTime().toTimeZone(timeZone);

    // time zone changes can lead to 00:00:00 becomes 01:00:00 and 23:59:59 becomes 00:59:59 (invalid range)
    const bool dateShown = (sections & QDateTimeEdit::DateSections_Mask);
    if (!dateShown) {
        if (minimum.toTime() >= maximum.toTime()){
            minimum = value.toDate().startOfDay(timeZone);
            maximum = value.toDate().endOfDay(timeZone);
        }
    }
}